

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O2

void ApplyAlphaMultiply_SSE2(uint8_t *rgba,int alpha_first,int w,int h,int stride)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  unkuint9 Var14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [13];
  undefined1 auVar17 [15];
  undefined1 auVar18 [11];
  undefined1 auVar19 [13];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint8_t *puVar27;
  long lVar28;
  uint8_t *puVar29;
  ulong uVar30;
  int iVar31;
  undefined1 auVar32 [16];
  ushort uVar33;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  undefined1 in_XMM6 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ushort uVar44;
  undefined1 auVar37 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  auVar26 = _DAT_001a8f80;
  auVar25 = _DAT_001a8f70;
  auVar24 = _DAT_001a8f40;
  lVar28 = (long)w;
  puVar29 = rgba + (ulong)(alpha_first == 0) * 3;
  puVar27 = rgba + (alpha_first != 0);
  while (0 < h) {
    uVar30 = 0;
    if (alpha_first == 0) {
      while ((long)(uVar30 + 4) <= lVar28) {
        auVar36 = *(undefined1 (*) [16])(rgba + uVar30 * 4);
        auVar2[0xd] = 0;
        auVar2._0_13_ = auVar36._0_13_;
        auVar2[0xe] = auVar36[7];
        auVar4[0xc] = auVar36[6];
        auVar4._0_12_ = auVar36._0_12_;
        auVar4._13_2_ = auVar2._13_2_;
        auVar6[0xb] = 0;
        auVar6._0_11_ = auVar36._0_11_;
        auVar6._12_3_ = auVar4._12_3_;
        auVar8[10] = auVar36[5];
        auVar8._0_10_ = auVar36._0_10_;
        auVar8._11_4_ = auVar6._11_4_;
        auVar10[9] = 0;
        auVar10._0_9_ = auVar36._0_9_;
        auVar10._10_5_ = auVar8._10_5_;
        auVar12[8] = auVar36[4];
        auVar12._0_8_ = auVar36._0_8_;
        auVar12._9_6_ = auVar10._9_6_;
        auVar17._7_8_ = 0;
        auVar17._0_7_ = auVar12._8_7_;
        Var14 = CONCAT81(SUB158(auVar17 << 0x40,7),auVar36[3]);
        auVar22._9_6_ = 0;
        auVar22._0_9_ = Var14;
        auVar18._1_10_ = SUB1510(auVar22 << 0x30,5);
        auVar18[0] = auVar36[2];
        auVar23._11_4_ = 0;
        auVar23._0_11_ = auVar18;
        auVar19._1_12_ = SUB1512(auVar23 << 0x20,3);
        auVar19[0] = auVar36[1];
        auVar45._0_2_ = CONCAT11(0,auVar36[0]);
        auVar45._2_13_ = auVar19;
        auVar45[0xf] = 0;
        auVar34._0_2_ = CONCAT11(0,auVar36[8]);
        auVar34[2] = auVar36[9];
        auVar34[3] = 0;
        auVar34[4] = auVar36[10];
        auVar34[5] = 0;
        auVar34[6] = auVar36[0xb];
        auVar34[7] = 0;
        auVar34[8] = auVar36[0xc];
        auVar34[9] = 0;
        auVar34[10] = auVar36[0xd];
        auVar34[0xb] = 0;
        auVar34[0xc] = auVar36[0xe];
        auVar34[0xd] = 0;
        auVar34[0xe] = auVar36[0xf];
        auVar34[0xf] = 0;
        auVar37 = pshuflw(in_XMM6,auVar45,0xbf);
        auVar37 = pshufhw(auVar37,auVar37,0xbf);
        auVar37 = auVar37 | auVar24;
        auVar47 = pshuflw(in_XMM7,auVar34,0xbf);
        auVar48 = pshufhw(auVar47,auVar47,0xbf);
        auVar48 = auVar48 | auVar24;
        auVar47._0_2_ = auVar37._0_2_ * auVar45._0_2_;
        auVar47._2_2_ = auVar37._2_2_ * auVar19._0_2_;
        auVar47._4_2_ = auVar37._4_2_ * auVar18._0_2_;
        auVar47._6_2_ = auVar37._6_2_ * (short)Var14;
        auVar47._8_2_ = auVar37._8_2_ * auVar12._8_2_;
        auVar47._10_2_ = auVar37._10_2_ * auVar8._10_2_;
        auVar47._12_2_ = auVar37._12_2_ * auVar4._12_2_;
        auVar47._14_2_ = auVar37._14_2_ * (auVar2._13_2_ >> 8);
        auVar37._0_2_ = auVar48._0_2_ * auVar34._0_2_;
        auVar37._2_2_ = auVar48._2_2_ * (ushort)auVar36[9];
        auVar37._4_2_ = auVar48._4_2_ * (ushort)auVar36[10];
        auVar37._6_2_ = auVar48._6_2_ * (ushort)auVar36[0xb];
        auVar37._8_2_ = auVar48._8_2_ * (ushort)auVar36[0xc];
        auVar37._10_2_ = auVar48._10_2_ * (ushort)auVar36[0xd];
        auVar37._12_2_ = auVar48._12_2_ * (ushort)auVar36[0xe];
        auVar37._14_2_ = auVar48._14_2_ * (ushort)auVar36[0xf];
        auVar36 = pmulhuw(auVar47,auVar25);
        auVar34 = pmulhuw(auVar37,auVar25);
        uVar33 = auVar36._0_2_ >> 7;
        uVar38 = auVar36._2_2_ >> 7;
        uVar39 = auVar36._4_2_ >> 7;
        uVar40 = auVar36._6_2_ >> 7;
        uVar41 = auVar36._8_2_ >> 7;
        uVar42 = auVar36._10_2_ >> 7;
        uVar43 = auVar36._12_2_ >> 7;
        uVar44 = auVar36._14_2_ >> 7;
        in_XMM7._0_2_ = auVar34._0_2_ >> 7;
        in_XMM7._2_2_ = auVar34._2_2_ >> 7;
        in_XMM7._4_2_ = auVar34._4_2_ >> 7;
        in_XMM7._6_2_ = auVar34._6_2_ >> 7;
        in_XMM7._8_2_ = auVar34._8_2_ >> 7;
        in_XMM7._10_2_ = auVar34._10_2_ >> 7;
        in_XMM7._12_2_ = auVar34._12_2_ >> 7;
        in_XMM7._14_2_ = auVar34._14_2_ >> 7;
        in_XMM6[1] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
        in_XMM6[0] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
        in_XMM6[2] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
        in_XMM6[3] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
        in_XMM6[4] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
        in_XMM6[5] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
        in_XMM6[6] = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
        in_XMM6[7] = (uVar44 != 0) * (uVar44 < 0x100) * (char)uVar44 - (0xff < uVar44);
        in_XMM6[8] = (in_XMM7._0_2_ != 0) * (in_XMM7._0_2_ < 0x100) * (char)in_XMM7._0_2_ -
                     (0xff < in_XMM7._0_2_);
        in_XMM6[9] = (in_XMM7._2_2_ != 0) * (in_XMM7._2_2_ < 0x100) * (char)in_XMM7._2_2_ -
                     (0xff < in_XMM7._2_2_);
        in_XMM6[10] = (in_XMM7._4_2_ != 0) * (in_XMM7._4_2_ < 0x100) * (char)in_XMM7._4_2_ -
                      (0xff < in_XMM7._4_2_);
        in_XMM6[0xb] = (in_XMM7._6_2_ != 0) * (in_XMM7._6_2_ < 0x100) * (char)in_XMM7._6_2_ -
                       (0xff < in_XMM7._6_2_);
        in_XMM6[0xc] = (in_XMM7._8_2_ != 0) * (in_XMM7._8_2_ < 0x100) * (char)in_XMM7._8_2_ -
                       (0xff < in_XMM7._8_2_);
        in_XMM6[0xd] = (in_XMM7._10_2_ != 0) * (in_XMM7._10_2_ < 0x100) * (char)in_XMM7._10_2_ -
                       (0xff < in_XMM7._10_2_);
        in_XMM6[0xe] = (in_XMM7._12_2_ != 0) * (in_XMM7._12_2_ < 0x100) * (char)in_XMM7._12_2_ -
                       (0xff < in_XMM7._12_2_);
        in_XMM6[0xf] = (in_XMM7._14_2_ != 0) * (in_XMM7._14_2_ < 0x100) * (char)in_XMM7._14_2_ -
                       (0xff < in_XMM7._14_2_);
        *(undefined1 (*) [16])(rgba + uVar30 * 4) = in_XMM6;
        uVar30 = uVar30 + 4;
      }
    }
    else {
      while ((long)(uVar30 + 4) <= lVar28) {
        auVar36 = *(undefined1 (*) [16])(rgba + uVar30 * 4);
        auVar1[0xd] = 0;
        auVar1._0_13_ = auVar36._0_13_;
        auVar1[0xe] = auVar36[7];
        auVar3[0xc] = auVar36[6];
        auVar3._0_12_ = auVar36._0_12_;
        auVar3._13_2_ = auVar1._13_2_;
        auVar5[0xb] = 0;
        auVar5._0_11_ = auVar36._0_11_;
        auVar5._12_3_ = auVar3._12_3_;
        auVar7[10] = auVar36[5];
        auVar7._0_10_ = auVar36._0_10_;
        auVar7._11_4_ = auVar5._11_4_;
        auVar9[9] = 0;
        auVar9._0_9_ = auVar36._0_9_;
        auVar9._10_5_ = auVar7._10_5_;
        auVar11[8] = auVar36[4];
        auVar11._0_8_ = auVar36._0_8_;
        auVar11._9_6_ = auVar9._9_6_;
        auVar13._7_8_ = 0;
        auVar13._0_7_ = auVar11._8_7_;
        Var14 = CONCAT81(SUB158(auVar13 << 0x40,7),auVar36[3]);
        auVar20._9_6_ = 0;
        auVar20._0_9_ = Var14;
        auVar15._1_10_ = SUB1510(auVar20 << 0x30,5);
        auVar15[0] = auVar36[2];
        auVar21._11_4_ = 0;
        auVar21._0_11_ = auVar15;
        auVar16._1_12_ = SUB1512(auVar21 << 0x20,3);
        auVar16[0] = auVar36[1];
        auVar32._0_2_ = CONCAT11(0,auVar36[0]);
        auVar32._2_13_ = auVar16;
        auVar32[0xf] = 0;
        auVar48._0_2_ = CONCAT11(0,auVar36[8]);
        auVar48[2] = auVar36[9];
        auVar48[3] = 0;
        auVar48[4] = auVar36[10];
        auVar48[5] = 0;
        auVar48[6] = auVar36[0xb];
        auVar48[7] = 0;
        auVar48[8] = auVar36[0xc];
        auVar48[9] = 0;
        auVar48[10] = auVar36[0xd];
        auVar48[0xb] = 0;
        auVar48[0xc] = auVar36[0xe];
        auVar48[0xd] = 0;
        auVar48[0xe] = auVar36[0xf];
        auVar48[0xf] = 0;
        auVar34 = pshuflw(in_XMM6,auVar32,1);
        auVar34 = pshufhw(auVar34,auVar34,1);
        auVar34 = auVar34 | auVar26;
        auVar45 = pshuflw(in_XMM7,auVar48,1);
        auVar45 = pshufhw(auVar45,auVar45,1);
        auVar45 = auVar45 | auVar26;
        auVar35._0_2_ = auVar34._0_2_ * auVar32._0_2_;
        auVar35._2_2_ = auVar34._2_2_ * auVar16._0_2_;
        auVar35._4_2_ = auVar34._4_2_ * auVar15._0_2_;
        auVar35._6_2_ = auVar34._6_2_ * (short)Var14;
        auVar35._8_2_ = auVar34._8_2_ * auVar11._8_2_;
        auVar35._10_2_ = auVar34._10_2_ * auVar7._10_2_;
        auVar35._12_2_ = auVar34._12_2_ * auVar3._12_2_;
        auVar35._14_2_ = auVar34._14_2_ * (auVar1._13_2_ >> 8);
        auVar46._0_2_ = auVar45._0_2_ * auVar48._0_2_;
        auVar46._2_2_ = auVar45._2_2_ * (ushort)auVar36[9];
        auVar46._4_2_ = auVar45._4_2_ * (ushort)auVar36[10];
        auVar46._6_2_ = auVar45._6_2_ * (ushort)auVar36[0xb];
        auVar46._8_2_ = auVar45._8_2_ * (ushort)auVar36[0xc];
        auVar46._10_2_ = auVar45._10_2_ * (ushort)auVar36[0xd];
        auVar46._12_2_ = auVar45._12_2_ * (ushort)auVar36[0xe];
        auVar46._14_2_ = auVar45._14_2_ * (ushort)auVar36[0xf];
        auVar36 = pmulhuw(auVar35,auVar25);
        auVar34 = pmulhuw(auVar46,auVar25);
        uVar33 = auVar36._0_2_ >> 7;
        uVar38 = auVar36._2_2_ >> 7;
        uVar39 = auVar36._4_2_ >> 7;
        uVar40 = auVar36._6_2_ >> 7;
        uVar41 = auVar36._8_2_ >> 7;
        uVar42 = auVar36._10_2_ >> 7;
        uVar43 = auVar36._12_2_ >> 7;
        uVar44 = auVar36._14_2_ >> 7;
        in_XMM7._0_2_ = auVar34._0_2_ >> 7;
        in_XMM7._2_2_ = auVar34._2_2_ >> 7;
        in_XMM7._4_2_ = auVar34._4_2_ >> 7;
        in_XMM7._6_2_ = auVar34._6_2_ >> 7;
        in_XMM7._8_2_ = auVar34._8_2_ >> 7;
        in_XMM7._10_2_ = auVar34._10_2_ >> 7;
        in_XMM7._12_2_ = auVar34._12_2_ >> 7;
        in_XMM7._14_2_ = auVar34._14_2_ >> 7;
        in_XMM6[1] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
        in_XMM6[0] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
        in_XMM6[2] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
        in_XMM6[3] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
        in_XMM6[4] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
        in_XMM6[5] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
        in_XMM6[6] = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
        in_XMM6[7] = (uVar44 != 0) * (uVar44 < 0x100) * (char)uVar44 - (0xff < uVar44);
        in_XMM6[8] = (in_XMM7._0_2_ != 0) * (in_XMM7._0_2_ < 0x100) * (char)in_XMM7._0_2_ -
                     (0xff < in_XMM7._0_2_);
        in_XMM6[9] = (in_XMM7._2_2_ != 0) * (in_XMM7._2_2_ < 0x100) * (char)in_XMM7._2_2_ -
                     (0xff < in_XMM7._2_2_);
        in_XMM6[10] = (in_XMM7._4_2_ != 0) * (in_XMM7._4_2_ < 0x100) * (char)in_XMM7._4_2_ -
                      (0xff < in_XMM7._4_2_);
        in_XMM6[0xb] = (in_XMM7._6_2_ != 0) * (in_XMM7._6_2_ < 0x100) * (char)in_XMM7._6_2_ -
                       (0xff < in_XMM7._6_2_);
        in_XMM6[0xc] = (in_XMM7._8_2_ != 0) * (in_XMM7._8_2_ < 0x100) * (char)in_XMM7._8_2_ -
                       (0xff < in_XMM7._8_2_);
        in_XMM6[0xd] = (in_XMM7._10_2_ != 0) * (in_XMM7._10_2_ < 0x100) * (char)in_XMM7._10_2_ -
                       (0xff < in_XMM7._10_2_);
        in_XMM6[0xe] = (in_XMM7._12_2_ != 0) * (in_XMM7._12_2_ < 0x100) * (char)in_XMM7._12_2_ -
                       (0xff < in_XMM7._12_2_);
        in_XMM6[0xf] = (in_XMM7._14_2_ != 0) * (in_XMM7._14_2_ < 0x100) * (char)in_XMM7._14_2_ -
                       (0xff < in_XMM7._14_2_);
        *(undefined1 (*) [16])(rgba + uVar30 * 4) = in_XMM6;
        uVar30 = uVar30 + 4;
      }
    }
    h = h + -1;
    for (uVar30 = uVar30 & 0xffffffff; (long)uVar30 < lVar28; uVar30 = uVar30 + 1) {
      if (puVar29[uVar30 * 4] != 0xff) {
        iVar31 = (uint)puVar29[uVar30 * 4] * 0x8081;
        puVar27[uVar30 * 4] = (uint8_t)((uint)puVar27[uVar30 * 4] * iVar31 >> 0x17);
        puVar27[uVar30 * 4 + 1] = (uint8_t)((uint)puVar27[uVar30 * 4 + 1] * iVar31 >> 0x17);
        puVar27[uVar30 * 4 + 2] = (uint8_t)((uint)puVar27[uVar30 * 4 + 2] * iVar31 >> 0x17);
      }
    }
    rgba = rgba + stride;
    puVar29 = puVar29 + stride;
    puVar27 = puVar27 + stride;
  }
  return;
}

Assistant:

void ApplyAlphaMultiply_SSE2(uint8_t* rgba, int alpha_first,
                                    int w, int h, int stride) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i kMult = _mm_set1_epi16((short)0x8081);
  const __m128i kMask = _mm_set_epi16(0, 0xff, 0xff, 0, 0, 0xff, 0xff, 0);
  const int kSpan = 4;
  while (h-- > 0) {
    uint32_t* const rgbx = (uint32_t*)rgba;
    int i;
    if (!alpha_first) {
      for (i = 0; i + kSpan <= w; i += kSpan) {
        APPLY_ALPHA(rgbx[i], _MM_SHUFFLE(2, 3, 3, 3));
      }
    } else {
      for (i = 0; i + kSpan <= w; i += kSpan) {
        APPLY_ALPHA(rgbx[i], _MM_SHUFFLE(0, 0, 0, 1));
      }
    }
    // Finish with left-overs.
    for (; i < w; ++i) {
      uint8_t* const rgb = rgba + (alpha_first ? 1 : 0);
      const uint8_t* const alpha = rgba + (alpha_first ? 0 : 3);
      const uint32_t a = alpha[4 * i];
      if (a != 0xff) {
        const uint32_t mult = MULTIPLIER(a);
        rgb[4 * i + 0] = PREMULTIPLY(rgb[4 * i + 0], mult);
        rgb[4 * i + 1] = PREMULTIPLY(rgb[4 * i + 1], mult);
        rgb[4 * i + 2] = PREMULTIPLY(rgb[4 * i + 2], mult);
      }
    }
    rgba += stride;
  }
}